

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O0

int push_length_and_tx(uchar **cursor,size_t *max,wally_tx *tx,uint32_t flags)

{
  uchar *bytes_out;
  uchar *p;
  size_t tx_len;
  int ret;
  uint32_t flags_local;
  wally_tx *tx_local;
  size_t *max_local;
  uchar **cursor_local;
  
  tx_len._4_4_ = flags;
  _ret = tx;
  tx_local = (wally_tx *)max;
  max_local = (size_t *)cursor;
  tx_len._0_4_ = wally_tx_get_length(tx,flags,(size_t *)&p);
  cursor_local._4_4_ = (int)tx_len;
  if ((int)tx_len == 0) {
    push_varint((uchar **)max_local,(size_t *)tx_local,(uint64_t)p);
    bytes_out = push_bytes((uchar **)max_local,(size_t *)tx_local,(void *)0x0,(size_t)p);
    if (bytes_out == (uchar *)0x0) {
      cursor_local._4_4_ = 0;
    }
    else {
      cursor_local._4_4_ = wally_tx_to_bytes(_ret,tx_len._4_4_,bytes_out,(size_t)p,(size_t *)&p);
    }
  }
  return cursor_local._4_4_;
}

Assistant:

static int push_length_and_tx(unsigned char **cursor, size_t *max,
                              const struct wally_tx *tx, uint32_t flags)
{
    int ret;
    size_t tx_len;
    unsigned char *p;

    if ((ret = wally_tx_get_length(tx, flags, &tx_len)) != WALLY_OK)
        return ret;

    push_varint(cursor, max, tx_len);

    /* TODO: convert wally_tx to use push  */
    if (!(p = push_bytes(cursor, max, NULL, tx_len)))
        return WALLY_OK; /* We catch this in caller. */

    return wally_tx_to_bytes(tx, flags, p, tx_len, &tx_len);
}